

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

WeakArenaReference<Js::IDiagObjectModelWalkerBase> *
Js::CreateAWalker<Js::RecyclableTypedArrayWalker>
          (ScriptContext *scriptContext,Var instance,Var originalInstance)

{
  LONG *pLVar1;
  ReferencedArenaAdapter *pRVar2;
  RecyclableTypedArrayWalker *this;
  HeapAllocator *alloc;
  WeakArenaReference<Js::IDiagObjectModelWalkerBase> *pWVar3;
  ArenaAllocator *alloc_00;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  pRVar2 = DebugManager::GetDiagnosticArena(scriptContext->threadContext->debugManager);
  if (pRVar2 == (ReferencedArenaAdapter *)0x0) {
    pWVar3 = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0;
  }
  else {
    alloc_00 = (ArenaAllocator *)0x0;
    if (pRVar2->deleteFlag == false) {
      alloc_00 = pRVar2->arena;
    }
    this = (RecyclableTypedArrayWalker *)new<Memory::ArenaAllocator>(0x50,alloc_00,0x364470);
    RecyclableTypedArrayWalker::RecyclableTypedArrayWalker
              (this,scriptContext,instance,originalInstance);
    local_58 = (undefined1  [8])
               &Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_3d7af45;
    data.filename._0_4_ = 0x33;
    alloc = Memory::HeapAllocator::TrackAllocInfo
                      (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
    pWVar3 = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)
             new<Memory::HeapAllocator>(0x10,alloc,0x2ff150);
    pWVar3->adapter = pRVar2;
    pWVar3->p = (IDiagObjectModelWalkerBase *)this;
    LOCK();
    pLVar1 = &(pRVar2->super_RefCounted).refCount;
    *pLVar1 = *pLVar1 + 1;
    UNLOCK();
  }
  return pWVar3;
}

Assistant:

WeakArenaReference<IDiagObjectModelWalkerBase>* CreateAWalker(ScriptContext * scriptContext, Var instance, Var originalInstance)
    {
        ReferencedArenaAdapter* pRefArena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena();
        if (pRefArena)
        {
            IDiagObjectModelWalkerBase* pOMWalker = Anew(pRefArena->Arena(), T, scriptContext, instance, originalInstance);
            return HeapNew(WeakArenaReference<IDiagObjectModelWalkerBase>,pRefArena, pOMWalker);
        }
        return nullptr;
    }